

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_COORD.cpp
# Opt level: O0

void __thiscall PP_COORD::show(PP_COORD *this)

{
  ostream *poVar1;
  PP_COORD *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"(x,y,z)=(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->y);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->z);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PP_COORD::show(void)
{
    std::cout << "(x,y,z)=(" << x << "," << y << "," << z << ")" << std::endl;
}